

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O1

void duckdb_hll::sdsrange(sds s,ssize_t start,ssize_t end)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong __n;
  
  switch(s[-1] & 7) {
  case 0:
    uVar1 = (ulong)((byte)s[-1] >> 3);
    break;
  case 1:
    uVar1 = (ulong)(byte)s[-4];
    break;
  case 2:
    uVar1 = (ulong)*(ushort *)(s + -6);
    break;
  case 3:
    uVar1 = (ulong)*(uint *)(s + -10);
    break;
  case 4:
    uVar1 = *(ulong *)(s + -0x12);
    break;
  default:
    uVar1 = 0;
  }
  if (uVar1 != 0) {
    __n = 0;
    uVar2 = uVar1 + start;
    if ((long)(uVar1 + start) < 1) {
      uVar2 = __n;
    }
    if (-1 < start) {
      uVar2 = start;
    }
    uVar5 = uVar1 + end;
    if ((long)(uVar1 + end) < 1) {
      uVar5 = __n;
    }
    if (-1 < end) {
      uVar5 = end;
    }
    uVar3 = (uVar5 - uVar2) + 1;
    if (uVar5 < uVar2) {
      uVar3 = __n;
    }
    uVar4 = 0;
    if (uVar3 != 0) {
      uVar4 = uVar2;
      if (uVar1 - uVar2 == 0 || (long)uVar1 < (long)uVar2) {
        __n = 0;
      }
      else {
        __n = uVar3;
        if (((long)uVar1 <= (long)uVar5) && (__n = uVar1 - uVar2, (long)(uVar1 - 1) < (long)uVar2))
        {
          __n = 0;
        }
      }
    }
    if ((uVar4 != 0) && (__n != 0)) {
      memmove(s,s + uVar4,__n);
    }
    s[__n] = '\0';
    switch(s[-1] & 7) {
    case 0:
      s[-1] = (char)__n << 3;
      break;
    case 1:
      s[-4] = (char)__n;
      break;
    case 2:
      *(short *)(s + -6) = (short)__n;
      break;
    case 3:
      *(int *)(s + -10) = (int)__n;
      break;
    case 4:
      *(ulong *)(s + -0x12) = __n;
    }
  }
  return;
}

Assistant:

void sdsrange(sds s, ssize_t start, ssize_t end) {
    size_t newlen, len = sdslen(s);

    if (len == 0) return;
    if (start < 0) {
        start = len+start;
        if (start < 0) start = 0;
    }
    if (end < 0) {
        end = len+end;
        if (end < 0) end = 0;
    }
    newlen = (start > end) ? 0 : (end-start)+1;
    if (newlen != 0) {
        if (start >= (ssize_t)len) {
            newlen = 0;
        } else if (end >= (ssize_t)len) {
            end = len-1;
            newlen = (start > end) ? 0 : (end-start)+1;
        }
    } else {
        start = 0;
    }
    if (start && newlen) memmove(s, s+start, newlen);
    s[newlen] = 0;
    sdssetlen(s,newlen);
}